

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O3

void __thiscall ncnn::Yolov3Detection::~Yolov3Detection(Yolov3Detection *this)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov3Detection_00189d48;
  if (this->softmax != (Layer *)0x0) {
    (*this->softmax->_vptr_Layer[1])();
    this->softmax = (Layer *)0x0;
  }
  if (this->sigmoid != (Layer *)0x0) {
    (*this->sigmoid->_vptr_Layer[1])();
    this->sigmoid = (Layer *)0x0;
  }
  piVar1 = (this->biases).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      __ptr = (this->biases).data;
      pAVar2 = (this->biases).allocator;
      if (pAVar2 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (**(code **)(*(long *)pAVar2 + 0x18))();
      }
    }
  }
  *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
  (this->biases).data = (void *)0x0;
  (this->biases).refcount = (int *)0x0;
  (this->biases).dims = 0;
  (this->biases).w = 0;
  (this->biases).h = 0;
  (this->biases).c = 0;
  (this->biases).cstep = 0;
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

Yolov3Detection::~Yolov3Detection()
{
    if (NULL != softmax)
    {
        delete softmax;
        softmax = NULL;
    }

    if (NULL != sigmoid)
    {
        delete sigmoid;
        sigmoid = NULL;
    }
}